

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csg.h
# Opt level: O2

object * ocmesh::details::scale(object *node,float factor)

{
  object *poVar1;
  anon_union_4_3_4e90da17_for_tvec3<float,_(glm::precision)0>_2 local_c;
  float local_8;
  float local_4;
  
  if ((factor == 0.0) && (!NAN(factor))) {
    __assert_fail("factor != 0 && \"Scaling factor must be non-zero\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nicola-gigante[P]ocmesh/include/csg.h"
                  ,0x183,"object *ocmesh::details::scale(object *, float)");
  }
  local_c.x = factor;
  local_8 = factor;
  local_4 = factor;
  poVar1 = scale(node,(vec3 *)&local_c);
  return poVar1;
}

Assistant:

inline object *scale(object *node, float factor) {
        assert(factor != 0 && "Scaling factor must be non-zero");
        return scale(node, { factor, factor, factor });
    }